

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O1

void write_archive(archive *a,bsdtar *bsdtar)

{
  char cVar1;
  char **ppcVar2;
  char **ppcVar3;
  FILE *f;
  ulong uVar4;
  bsdtar_conflict *pbVar5;
  bsdtar_conflict *pbVar6;
  int iVar7;
  wchar_t wVar8;
  int code;
  char *pcVar9;
  archive_entry_linkresolver *res;
  archive *paVar10;
  lafe_line_reader *lr;
  archive *a_00;
  int64_t iVar11;
  archive_entry *entry_00;
  int *piVar12;
  ulong uVar13;
  char *pcVar14;
  archive_entry *entry;
  archive_entry *sparse_entry;
  archive_entry *local_48;
  bsdtar_conflict *local_40;
  archive_entry *local_38;
  
  uVar4 = 0x10000;
  do {
    uVar13 = uVar4;
    uVar4 = uVar13 * 2;
  } while (uVar13 < (ulong)(long)bsdtar->bytes_per_block);
  bsdtar->buff_size = uVar13 | 0x4000;
  pcVar9 = (char *)malloc(uVar13 | 0x4000);
  bsdtar->buff = pcVar9;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "cannot allocate memory";
  }
  else {
    res = archive_entry_linkresolver_new();
    bsdtar->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar9 = "cannot create link resolver";
    }
    else {
      iVar7 = archive_format(a);
      archive_entry_linkresolver_set_strategy(res,iVar7);
      paVar10 = archive_read_disk_new();
      bsdtar->diskreader = paVar10;
      if (paVar10 != (archive *)0x0) {
        if (bsdtar->symlink_mode == 'L') {
          archive_read_disk_set_symlink_logical(paVar10);
        }
        else if (bsdtar->symlink_mode == 'H') {
          archive_read_disk_set_symlink_hybrid(paVar10);
        }
        else {
          archive_read_disk_set_symlink_physical(paVar10);
        }
        archive_read_disk_set_matching(bsdtar->diskreader,bsdtar->matching,excluded_callback,bsdtar)
        ;
        archive_read_disk_set_metadata_filter_callback(bsdtar->diskreader,metadata_filter,bsdtar);
        archive_read_disk_set_behavior(bsdtar->diskreader,bsdtar->readdisk_flags);
        archive_read_disk_set_standard_lookup(bsdtar->diskreader);
        if (bsdtar->names_from_file != (char *)0x0) {
          bsdtar->next_line_is_dir = '\0';
          lr = lafe_line_reader(bsdtar->names_from_file,(int)bsdtar->option_null);
          pcVar9 = lafe_line_reader_next(lr);
          while (pcVar9 != (char *)0x0) {
            if (bsdtar->next_line_is_dir == '\0') {
              if ((bsdtar->option_null == '\0') && (iVar7 = strcmp(pcVar9,"-C"), iVar7 == 0)) {
                bsdtar->next_line_is_dir = '\x01';
              }
              else {
                if (*pcVar9 != '/') {
                  do_chdir((bsdtar_conflict *)bsdtar);
                }
                write_hierarchy(bsdtar,a,pcVar9);
              }
            }
            else {
              if (*pcVar9 == '\0') {
                lafe_warnc(0,"Meaningless argument for -C: \'\'");
                bsdtar->return_value = 1;
              }
              else {
                set_chdir((bsdtar_conflict *)bsdtar,pcVar9);
              }
              bsdtar->next_line_is_dir = '\0';
            }
            pcVar9 = lafe_line_reader_next(lr);
          }
          lafe_line_reader_free(lr);
          if (bsdtar->next_line_is_dir != '\0') {
            piVar12 = __errno_location();
            iVar7 = *piVar12;
            pcVar9 = "Unexpected end of filename list; directory expected after -C";
            goto LAB_00112941;
          }
        }
        ppcVar2 = bsdtar->argv;
        pcVar9 = *ppcVar2;
        pbVar6 = (bsdtar_conflict *)bsdtar;
        pbVar5 = local_40;
joined_r0x00112422:
        local_40 = pbVar6;
        if (pcVar9 == (char *)0x0) goto LAB_001126de;
        cVar1 = *pcVar9;
        if (cVar1 == '@') {
          if (pcVar9[1] != '/') {
LAB_0011246f:
            do_chdir((bsdtar_conflict *)bsdtar);
          }
LAB_00112477:
          if (*pcVar9 == '@') {
            pcVar9 = pcVar9 + 1;
            paVar10 = (archive *)0x173cec;
            iVar7 = strcmp(pcVar9,"-");
            pcVar14 = pcVar9;
            if (iVar7 == 0) {
              pcVar14 = (char *)0x0;
            }
            a_00 = archive_read_new();
            archive_read_support_format_all(a_00);
            archive_read_support_filter_all(a_00);
            set_reader_options((bsdtar *)a,paVar10);
            archive_read_set_options(a_00,"mtree:checkfs");
            wVar8 = archive_read_open_filename
                              (a_00,pcVar14,(long)((bsdtar_conflict *)bsdtar)->bytes_per_block);
            if (wVar8 == L'\0') {
LAB_0011265c:
              do {
                iVar7 = archive_read_next_header(a_00,&local_48);
                if (iVar7 != 0) goto code_r0x0011266f;
                wVar8 = archive_match_excluded(((bsdtar_conflict *)bsdtar)->matching,local_48);
                if (wVar8 == L'\0') {
                  if (((bsdtar_conflict *)bsdtar)->option_interactive != '\0') {
                    pcVar14 = archive_entry_pathname(local_48);
                    wVar8 = yes("copy \'%s\'",pcVar14);
                    if (wVar8 == L'\0') goto LAB_0011265c;
                  }
                  f = _stderr;
                  if (((bsdtar_conflict *)bsdtar)->verbose != L'\0') {
                    pcVar14 = archive_entry_pathname(local_48);
                    safe_fprintf((FILE_conflict *)f,"a %s",pcVar14);
                  }
                  iVar7 = need_report();
                  if (iVar7 != 0) {
                    report_write(bsdtar,a,local_48,0);
                  }
                  iVar7 = archive_write_header(a,local_48);
                  if (iVar7 != 0) {
                    if (((bsdtar_conflict *)bsdtar)->verbose == L'\0') {
                      pcVar14 = archive_entry_pathname(local_48);
                      archive_error_string(a);
                      bsdtar = (bsdtar *)local_40;
                      lafe_warnc(0,"%s: %s",pcVar14);
                    }
                    else {
                      write_archive_cold_1();
                    }
                    if (iVar7 == -0x1e) goto LAB_00112917;
                  }
                  if (-0x15 < iVar7) {
                    iVar11 = archive_entry_size(local_48);
                    if (iVar11 == 0) {
                      archive_read_data_skip(a_00);
                    }
                    else {
                      iVar7 = copy_file_data_block(bsdtar,a,a_00,local_48);
                      if (iVar7 != 0) {
LAB_00112917:
                        exit(1);
                      }
                    }
                  }
                  if (((bsdtar_conflict *)bsdtar)->verbose != L'\0') {
                    fputc(10,_stderr);
                  }
                }
              } while( true );
            }
            pcVar9 = archive_error_string(a_00);
            lafe_warnc(0,"%s",pcVar9);
            ((bsdtar_conflict *)bsdtar)->return_value = L'\x01';
          }
          else {
            write_hierarchy(bsdtar,a,pcVar9);
          }
          goto LAB_001126bf;
        }
        if (cVar1 == '/') goto LAB_00112477;
        if ((cVar1 != '-') || (pcVar9[1] != 'C')) goto LAB_0011246f;
        if (pcVar9[2] == '\0') {
          ((bsdtar_conflict *)bsdtar)->argv = ppcVar2 + 1;
          pcVar9 = ppcVar2[1];
          if (pcVar9 == (char *)0x0) {
            pcVar9 = "Missing argument for -C";
            goto LAB_00112848;
          }
          if (*pcVar9 == '\0') {
            lafe_warnc(0,"Meaningless argument for -C: \'\'");
            goto LAB_0011284f;
          }
        }
        else {
          pcVar9 = pcVar9 + 2;
        }
        set_chdir((bsdtar_conflict *)bsdtar,pcVar9);
        goto LAB_001126bf;
      }
      pcVar9 = "Cannot create read_disk object";
    }
  }
  iVar7 = 0;
LAB_00112941:
  lafe_errc(1,iVar7,pcVar9);
code_r0x0011266f:
  if (iVar7 != 1) {
    archive_error_string(a_00);
    lafe_warnc(0,"Error reading archive %s: %s",pcVar9);
    ((bsdtar_conflict *)bsdtar)->return_value = L'\x01';
    archive_read_free(a_00);
    pbVar5 = local_40;
    goto LAB_001126de;
  }
  archive_read_free(a_00);
LAB_001126bf:
  ppcVar3 = ((bsdtar_conflict *)bsdtar)->argv;
  ppcVar2 = ppcVar3 + 1;
  ((bsdtar_conflict *)bsdtar)->argv = ppcVar2;
  pcVar9 = ppcVar3[1];
  pbVar6 = local_40;
  pbVar5 = local_40;
  goto joined_r0x00112422;
LAB_001126de:
  local_40 = pbVar5;
  archive_read_disk_set_matching
            (((bsdtar_conflict *)bsdtar)->diskreader,(archive *)0x0,
             (_func_void_archive_ptr_void_ptr_archive_entry_ptr *)0x0,(void *)0x0);
  archive_read_disk_set_metadata_filter_callback
            (((bsdtar_conflict *)bsdtar)->diskreader,
             (_func_int_archive_ptr_void_ptr_archive_entry_ptr *)0x0,(void *)0x0);
  local_48 = (archive_entry *)0x0;
  archive_entry_linkify(((bsdtar_conflict *)bsdtar)->resolver,&local_48,&local_38);
joined_r0x00112724:
  do {
    if (local_48 == (archive_entry *)0x0) {
      iVar7 = archive_write_close(a);
      if (iVar7 != 0) {
        pcVar9 = archive_error_string(a);
LAB_00112848:
        lafe_warnc(0,"%s",pcVar9);
LAB_0011284f:
        ((bsdtar_conflict *)bsdtar)->return_value = L'\x01';
      }
      free(((bsdtar_conflict *)bsdtar)->buff);
      archive_entry_linkresolver_free(((bsdtar_conflict *)bsdtar)->resolver);
      ((bsdtar_conflict *)bsdtar)->resolver = (archive_entry_linkresolver *)0x0;
      archive_read_free(((bsdtar_conflict *)bsdtar)->diskreader);
      ((bsdtar_conflict *)bsdtar)->diskreader = (archive *)0x0;
      if (((bsdtar_conflict *)bsdtar)->option_totals != '\0') {
        write_archive_cold_2();
      }
      archive_write_free(a);
      return;
    }
    paVar10 = ((bsdtar_conflict *)bsdtar)->diskreader;
    pcVar9 = archive_entry_sourcepath(local_48);
    wVar8 = archive_read_disk_open(paVar10,pcVar9);
    if (wVar8 != L'\0') {
      iVar7 = archive_errno(paVar10);
      pcVar9 = archive_error_string(paVar10);
      lafe_warnc(iVar7,"%s",pcVar9);
LAB_0011276f:
      ((bsdtar_conflict *)bsdtar)->return_value = L'\x01';
LAB_0011277a:
      archive_entry_free(local_48);
      goto joined_r0x00112724;
    }
    entry_00 = archive_entry_new();
    iVar7 = archive_read_next_header2(paVar10,entry_00);
    archive_entry_free(entry_00);
    if (iVar7 != 0) {
      code = archive_errno(paVar10);
      pcVar9 = archive_error_string(paVar10);
      lafe_warnc(code,"%s",pcVar9);
      if (iVar7 == -0x1e) goto LAB_0011276f;
      archive_read_close(paVar10);
      goto LAB_0011277a;
    }
    write_file(bsdtar,a,local_48);
    archive_entry_free(local_48);
    archive_read_close(paVar10);
    local_48 = (archive_entry *)0x0;
    archive_entry_linkify(((bsdtar_conflict *)bsdtar)->resolver,&local_48,&local_38);
  } while( true );
}

Assistant:

static void
write_archive(struct archive *a, struct bsdtar *bsdtar)
{
	const char *arg;
	struct archive_entry *entry, *sparse_entry;

	/* Choose a suitable copy buffer size */
	bsdtar->buff_size = 64 * 1024;
	while (bsdtar->buff_size < (size_t)bsdtar->bytes_per_block)
	  bsdtar->buff_size *= 2;
	/* Try to compensate for space we'll lose to alignment. */
	bsdtar->buff_size += 16 * 1024;

	/* Allocate a buffer for file data. */
	if ((bsdtar->buff = malloc(bsdtar->buff_size)) == NULL)
		lafe_errc(1, 0, "cannot allocate memory");

	if ((bsdtar->resolver = archive_entry_linkresolver_new()) == NULL)
		lafe_errc(1, 0, "cannot create link resolver");
	archive_entry_linkresolver_set_strategy(bsdtar->resolver,
	    archive_format(a));

	/* Create a read_disk object. */
	if ((bsdtar->diskreader = archive_read_disk_new()) == NULL)
		lafe_errc(1, 0, "Cannot create read_disk object");
	/* Tell the read_disk how handle symlink. */
	switch (bsdtar->symlink_mode) {
	case 'H':
		archive_read_disk_set_symlink_hybrid(bsdtar->diskreader);
		break;
	case 'L':
		archive_read_disk_set_symlink_logical(bsdtar->diskreader);
		break;
	default:
		archive_read_disk_set_symlink_physical(bsdtar->diskreader);
		break;
	}
	/* Register entry filters. */
	archive_read_disk_set_matching(bsdtar->diskreader,
	    bsdtar->matching, excluded_callback, bsdtar);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, metadata_filter, bsdtar);
	/* Set the behavior of archive_read_disk. */
	archive_read_disk_set_behavior(bsdtar->diskreader,
	    bsdtar->readdisk_flags);
	archive_read_disk_set_standard_lookup(bsdtar->diskreader);

	if (bsdtar->names_from_file != NULL)
		archive_names_from_file(bsdtar, a);

	while (*bsdtar->argv) {
		arg = *bsdtar->argv;
		if (arg[0] == '-' && arg[1] == 'C') {
			arg += 2;
			if (*arg == '\0') {
				bsdtar->argv++;
				arg = *bsdtar->argv;
				if (arg == NULL) {
					lafe_warnc(0, "%s",
					    "Missing argument for -C");
					bsdtar->return_value = 1;
					goto cleanup;
				}
				if (*arg == '\0') {
					lafe_warnc(0,
					    "Meaningless argument for -C: ''");
					bsdtar->return_value = 1;
					goto cleanup;
				}
			}
			set_chdir(bsdtar, arg);
		} else {
			if (*arg != '/' && (arg[0] != '@' || arg[1] != '/'))
				do_chdir(bsdtar); /* Handle a deferred -C */
			if (*arg == '@') {
				if (append_archive_filename(bsdtar, a,
				    arg + 1) != 0)
					break;
			} else
				write_hierarchy(bsdtar, a, arg);
		}
		bsdtar->argv++;
	}

	archive_read_disk_set_matching(bsdtar->diskreader, NULL, NULL, NULL);
	archive_read_disk_set_metadata_filter_callback(
	    bsdtar->diskreader, NULL, NULL);
	entry = NULL;
	archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	while (entry != NULL) {
		int r;
		struct archive_entry *entry2;
		struct archive *disk = bsdtar->diskreader;

		/*
		 * This tricky code here is to correctly read the cotents
		 * of the entry because the disk reader bsdtar->diskreader
		 * is pointing at does not have any information about the
		 * entry by this time and using archive_read_data_block()
		 * with the disk reader consequently must fail. And we
		 * have to re-open the entry to read the contents.
		 */
		/* TODO: Work with -C option as well. */
		r = archive_read_disk_open(disk,
			archive_entry_sourcepath(entry));
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			bsdtar->return_value = 1;
			archive_entry_free(entry);
			continue;
		}

		/*
		 * Invoke archive_read_next_header2() to work
		 * archive_read_data_block(), which is called via write_file(),
		 * without failure.
		 */
		entry2 = archive_entry_new();
		r = archive_read_next_header2(disk, entry2);
		archive_entry_free(entry2);
		if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			if (r == ARCHIVE_FATAL)
				bsdtar->return_value = 1;
			else
				archive_read_close(disk);
			archive_entry_free(entry);
			continue;
		}

		write_file(bsdtar, a, entry);
		archive_entry_free(entry);
		archive_read_close(disk);
		entry = NULL;
		archive_entry_linkify(bsdtar->resolver, &entry, &sparse_entry);
	}

	if (archive_write_close(a)) {
		lafe_warnc(0, "%s", archive_error_string(a));
		bsdtar->return_value = 1;
	}

cleanup:
	/* Free file data buffer. */
	free(bsdtar->buff);
	archive_entry_linkresolver_free(bsdtar->resolver);
	bsdtar->resolver = NULL;
	archive_read_free(bsdtar->diskreader);
	bsdtar->diskreader = NULL;

	if (bsdtar->option_totals) {
		fprintf(stderr, "Total bytes written: %s\n",
		    tar_i64toa(archive_filter_bytes(a, -1)));
	}

	archive_write_free(a);
}